

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference(DescriptorKeyReference *this)

{
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeyNull;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  ::std::__cxx11::string::string((string *)&this->argument_);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference()
    : key_type_(DescriptorKeyType::kDescriptorKeyNull) {}